

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O2

void __thiscall Chip8::OP_FX0A(Chip8 *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LD V");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", K");
  poVar1 = std::operator<<(poVar1,
                           "                  ; Wait for a key press, store the value of the key in Vx."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Chip8::OP_FX0A() {
    std::cout << "LD V"<<((opcode & 0x0F00u) >> 8u) << ", K" << "                  ; Wait for a key press, store the value of the key in Vx." << std::endl;
}